

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_openssl.c
# Opt level: O3

ssize_t amqp_ssl_socket_writev(void *base,iovec *iov,int iovcnt)

{
  void *__dest;
  ssize_t sVar1;
  long lVar2;
  size_t __size;
  
  if (iovcnt < 1) {
    __size = 0;
  }
  else {
    lVar2 = 0;
    __size = 0;
    do {
      __size = __size + *(long *)((long)&iov->iov_len + lVar2);
      lVar2 = lVar2 + 0x10;
    } while ((ulong)(uint)iovcnt << 4 != lVar2);
    if (*(ulong *)((long)base + 0x28) < __size) {
      __dest = realloc(*(void **)((long)base + 0x20),__size);
      *(void **)((long)base + 0x20) = __dest;
      if (__dest == (void *)0x0) {
        *(undefined8 *)((long)base + 0x28) = 0;
        return -1;
      }
      *(size_t *)((long)base + 0x28) = __size;
      goto LAB_0010cb14;
    }
  }
  __dest = *(void **)((long)base + 0x20);
LAB_0010cb14:
  if (0 < iovcnt) {
    lVar2 = 0;
    do {
      memcpy(__dest,*(void **)((long)&iov->iov_base + lVar2),
             *(size_t *)((long)&iov->iov_len + lVar2));
      __dest = (void *)((long)__dest + *(long *)((long)&iov->iov_len + lVar2));
      lVar2 = lVar2 + 0x10;
    } while ((ulong)(uint)iovcnt << 4 != lVar2);
    __dest = *(void **)((long)base + 0x20);
  }
  sVar1 = amqp_ssl_socket_send(base,__dest,__size);
  return sVar1;
}

Assistant:

static ssize_t
amqp_ssl_socket_writev(void *base,
                       struct iovec *iov,
                       int iovcnt)
{
  struct amqp_ssl_socket_t *self = (struct amqp_ssl_socket_t *)base;
  ssize_t ret = -1;
  char *bufferp;
  size_t bytes;
  int i;
  bytes = 0;
  for (i = 0; i < iovcnt; ++i) {
    bytes += iov[i].iov_len;
  }
  if (self->length < bytes) {
    self->buffer = realloc(self->buffer, bytes);
    if (!self->buffer) {
      self->length = 0;
      ret = AMQP_STATUS_NO_MEMORY;
      goto exit;
    }
    self->length = bytes;
  }
  bufferp = self->buffer;
  for (i = 0; i < iovcnt; ++i) {
    memcpy(bufferp, iov[i].iov_base, iov[i].iov_len);
    bufferp += iov[i].iov_len;
  }
  ret = amqp_ssl_socket_send(self, self->buffer, bytes);
exit:
  return ret;
}